

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O1

void setPreferredVelocities(RVOSimulator *sim)

{
  pointer pRVar1;
  pointer pRVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  Vector2 *pVVar7;
  Vector2 *point1;
  size_t sVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vector2 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  sVar6 = RVO::RVOSimulator::getNumAgents(sim);
  if (0 < (int)sVar6) {
    sVar6 = 0;
    do {
      if ((int)((ulong)((long)roadmap.
                              super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)roadmap.
                             super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 < 1) {
        local_68._0_4_ = 0xffffffff;
      }
      else {
        local_68._0_4_ = 0xffffffff;
        lVar9 = 0;
        lVar10 = 0;
        fVar11 = 9e+09;
        do {
          pRVar1 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl
                   .super__Vector_impl_data._M_start;
          local_58._0_4_ = fVar11;
          pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,sVar6);
          fVar11 = *(float *)((long)&(pRVar1->position).x_ + lVar9) - pVVar7->x_;
          fVar13 = *(float *)((long)&(pRVar1->position).y_ + lVar9) - pVVar7->y_;
          fVar13 = fVar11 * fVar11 + fVar13 * fVar13;
          if (fVar13 < 0.0) {
            fVar13 = sqrtf(fVar13);
          }
          else {
            fVar13 = SQRT(fVar13);
          }
          fVar11 = (float)local_58._0_4_;
          if (fVar13 + *(float *)(*(long *)((long)&((roadmap.
                                                  super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  distToGoal).
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar9)
                                 + (long)goals.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start[sVar6] * 4) <
              (float)local_58._0_4_) {
            point1 = RVO::RVOSimulator::getAgentPosition(sim,sVar6);
            pVVar7 = &(roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                       _M_impl.super__Vector_impl_data._M_start)->position;
            fVar11 = RVO::RVOSimulator::getAgentRadius(sim,sVar6);
            bVar4 = RVO::RVOSimulator::queryVisibility
                              (sim,point1,(Vector2 *)((long)&pVVar7->x_ + lVar9),fVar11);
            pRVar1 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            fVar11 = (float)local_58._0_4_;
            if (bVar4) {
              pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,sVar6);
              fVar11 = *(float *)((long)&(pRVar1->position).x_ + lVar9) - pVVar7->x_;
              fVar13 = *(float *)((long)&(pRVar1->position).y_ + lVar9) - pVVar7->y_;
              fVar11 = fVar11 * fVar11 + fVar13 * fVar13;
              if (fVar11 < 0.0) {
                fVar11 = sqrtf(fVar11);
              }
              else {
                fVar11 = SQRT(fVar11);
              }
              local_68._0_4_ = (int)lVar10;
              fVar11 = fVar11 + *(float *)(*(long *)((long)&((roadmap.
                                                  super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  distToGoal).
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar9)
                                          + (long)goals.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[sVar6] *
                                            4);
            }
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x38;
        } while (lVar10 < (int)((ulong)((long)roadmap.
                                              super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)roadmap.
                                             super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249);
      }
      pRVar1 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = local_68._0_4_;
      if (local_68._0_4_ == -1) {
LAB_001053c9:
        local_70.x_ = 0.0;
        local_70.y_ = 0.0;
      }
      else {
        lVar9 = (long)(int)local_68._0_4_;
        pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,sVar6);
        pRVar2 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar11 = pRVar1[lVar9].position.x_ - pVVar7->x_;
        fVar13 = pRVar1[lVar9].position.y_ - pVVar7->y_;
        fVar11 = fVar11 * fVar11 + fVar13 * fVar13;
        if ((fVar11 != 0.0) || (NAN(fVar11))) {
          pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,sVar6);
          fVar11 = pRVar2[lVar9].position.x_;
          fVar13 = pRVar2[lVar9].position.y_;
        }
        else {
          if (uVar3 == goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar6]) goto LAB_001053c9;
          iVar5 = goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar6];
          pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,sVar6);
          fVar11 = pRVar2[iVar5].position.x_;
          fVar13 = pRVar2[iVar5].position.y_;
        }
        fVar11 = fVar11 - pVVar7->x_;
        fVar13 = fVar13 - pVVar7->y_;
        fVar12 = fVar11 * fVar11 + fVar13 * fVar13;
        if (fVar12 < 0.0) {
          local_58 = ZEXT416((uint)fVar11);
          local_68 = ZEXT416((uint)fVar13);
          fVar12 = sqrtf(fVar12);
          fVar11 = (float)local_58._0_4_;
          fVar13 = (float)local_68._0_4_;
        }
        else {
          fVar12 = SQRT(fVar12);
        }
        local_70.y_ = fVar13 * (1.0 / fVar12);
        local_70.x_ = fVar11 * (1.0 / fVar12);
      }
      RVO::RVOSimulator::setAgentPrefVelocity(sim,sVar6,&local_70);
      iVar5 = rand();
      local_58._0_4_ = (((float)iVar5 + (float)iVar5) * 3.1415927) / 2.1474836e+09;
      iVar5 = rand();
      local_68._0_4_ = (float)iVar5 * 0.0001 * 4.656613e-10;
      pVVar7 = RVO::RVOSimulator::getAgentPrefVelocity(sim,sVar6);
      local_48 = cosf((float)local_58._0_4_);
      fVar11 = sinf((float)local_58._0_4_);
      local_70.y_ = fVar11 * (float)local_68._0_4_ + pVVar7->y_;
      local_70.x_ = local_48 * (float)local_68._0_4_ + pVVar7->x_;
      RVO::RVOSimulator::setAgentPrefVelocity(sim,sVar6,&local_70);
      sVar6 = sVar6 + 1;
      sVar8 = RVO::RVOSimulator::getNumAgents(sim);
    } while ((long)sVar6 < (long)(int)sVar8);
  }
  return;
}

Assistant:

void setPreferredVelocities(RVO::RVOSimulator *sim)
{
	/*
	 * Set the preferred velocity to be a vector of unit magnitude (speed) in the
	 * direction of the visible roadmap vertex that is on the shortest path to the
	 * goal.
	 */
#ifdef _OPENMP
#pragma omp parallel for
#endif
	for (int i = 0; i < static_cast<int>(sim->getNumAgents()); ++i) {
		float minDist = 9e9f;
		int minVertex = -1;

		for (int j = 0; j < static_cast<int>(roadmap.size()); ++j) {
			if (RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]] < minDist &&
				sim->queryVisibility(sim->getAgentPosition(i), roadmap[j].position, sim->getAgentRadius(i))) {

				minDist = RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]];
				minVertex = j;
			}
		}

		if (minVertex == -1) {
			/* No roadmap vertex is visible; should not happen. */
			sim->setAgentPrefVelocity(i, RVO::Vector2(0, 0));
		}
		else {
			if (RVO::absSq(roadmap[minVertex].position -
			               sim->getAgentPosition(i)) == 0.0f) {
				if (minVertex == goals[i]) {
					sim->setAgentPrefVelocity(i, RVO::Vector2());
				}
				else {
					sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[goals[i]].position - sim->getAgentPosition(i)));
				}
			}
			else {
				sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[minVertex].position - sim->getAgentPosition(i)));
			}
		}

		/*
		 * Perturb a little to avoid deadlocks due to perfect symmetry.
		 */
		float angle = std::rand() * 2.0f * M_PI / RAND_MAX;
		float dist = std::rand() * 0.0001f / RAND_MAX;

		sim->setAgentPrefVelocity(i, sim->getAgentPrefVelocity(i) +
		                          dist * RVO::Vector2(std::cos(angle), std::sin(angle)));
	}
}